

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_short_Test::TestBody
          (ByteBufferTest_test_read_write_short_Test *this)

{
  char *pcVar1;
  AssertHelper local_90;
  int16_t short2;
  int16_t short1;
  AssertionResult gtest_ar_1;
  AssertHelper local_70;
  ByteBuffer byte_buffer2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer byte_buffer1;
  
  short1 = 0x236;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer1,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)&byte_buffer1);
  gtest_ar_1._0_2_ = bidfx_public_api::tools::ByteBuffer::ReadShort();
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)&byte_buffer2,"short1","byte_buffer1.ReadShort()",&short1,
             (short *)&gtest_ar_1);
  if (byte_buffer2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x97,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_60);
  short2 = -0x1b1;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer2,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)&byte_buffer2);
  local_90.data_._0_2_ = bidfx_public_api::tools::ByteBuffer::ReadShort();
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)&gtest_ar_1,"short2","byte_buffer2.ReadShort()",&short2,(short *)&local_90)
  ;
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x9c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer2);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer1);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_short)
{
    int16_t short1 = 566;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteShort(short1);
    EXPECT_EQ(short1, byte_buffer1.ReadShort());

    int16_t short2 = -433;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteShort(short2);
    EXPECT_EQ(short2, byte_buffer2.ReadShort());
}